

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265e_vepu511.c
# Opt level: O0

MPP_RET hal_h265e_vepu511_status_check(H265eV511RegSet *regs)

{
  MPP_RET local_14;
  MPP_RET ret;
  H265eV511RegSet *regs_local;
  
  local_14 = MPP_OK;
  if ((((uint)(regs->reg_ctl).int_sta >> 1 & 1) != 0) && ((hal_h265e_debug & 8) != 0)) {
    _mpp_log_l(4,"hal_h265e_v511","lkt_done finish",(char *)0x0);
  }
  if ((((uint)(regs->reg_ctl).int_sta & 1) != 0) && ((hal_h265e_debug & 8) != 0)) {
    _mpp_log_l(4,"hal_h265e_v511","enc_done finish",(char *)0x0);
  }
  if ((((uint)(regs->reg_ctl).int_sta >> 3 & 1) != 0) && ((hal_h265e_debug & 8) != 0)) {
    _mpp_log_l(4,"hal_h265e_v511","enc_slice finsh",(char *)0x0);
  }
  if ((((uint)(regs->reg_ctl).int_sta >> 2 & 1) != 0) && ((hal_h265e_debug & 8) != 0)) {
    _mpp_log_l(4,"hal_h265e_v511","safe clear finsh",(char *)0x0);
  }
  if (((uint)(regs->reg_ctl).int_sta >> 4 & 1) != 0) {
    _mpp_log_l(2,"hal_h265e_v511","bit stream overflow","hal_h265e_vepu511_status_check");
    local_14 = MPP_NOK;
  }
  if (((uint)(regs->reg_ctl).int_sta >> 5 & 1) != 0) {
    _mpp_log_l(2,"hal_h265e_v511","bus write full","hal_h265e_vepu511_status_check");
    local_14 = MPP_NOK;
  }
  if (((uint)(regs->reg_ctl).int_sta >> 6 & 1) != 0) {
    _mpp_log_l(2,"hal_h265e_v511","bus error","hal_h265e_vepu511_status_check");
    local_14 = MPP_NOK;
  }
  if (((uint)(regs->reg_ctl).int_sta >> 8 & 1) != 0) {
    _mpp_log_l(2,"hal_h265e_v511","wdg timeout","hal_h265e_vepu511_status_check");
    local_14 = MPP_NOK;
  }
  return local_14;
}

Assistant:

static MPP_RET hal_h265e_vepu511_status_check(H265eV511RegSet *regs)
{
    MPP_RET ret = MPP_OK;

    if (regs->reg_ctl.int_sta.lkt_node_done_sta)
        hal_h265e_dbg_detail("lkt_done finish");

    if (regs->reg_ctl.int_sta.enc_done_sta)
        hal_h265e_dbg_detail("enc_done finish");

    if (regs->reg_ctl.int_sta.vslc_done_sta)
        hal_h265e_dbg_detail("enc_slice finsh");

    if (regs->reg_ctl.int_sta.sclr_done_sta)
        hal_h265e_dbg_detail("safe clear finsh");

    if (regs->reg_ctl.int_sta.vbsf_oflw_sta) {
        mpp_err_f("bit stream overflow");
        ret = MPP_NOK;
    }

    if (regs->reg_ctl.int_sta.vbuf_lens_sta) {
        mpp_err_f("bus write full");
        ret = MPP_NOK;
    }

    if (regs->reg_ctl.int_sta.enc_err_sta) {
        mpp_err_f("bus error");
        ret = MPP_NOK;
    }

    if (regs->reg_ctl.int_sta.wdg_sta) {
        mpp_err_f("wdg timeout");
        ret = MPP_NOK;
    }

    return ret;
}